

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_mkdir(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path,fxp_attrs attrs)

{
  int iVar1;
  char *__path;
  SftpReplyBuilder *reply_00;
  
  __path = mkstr(path);
  reply_00 = (SftpReplyBuilder *)0x1ff;
  if (((undefined1  [56])attrs & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    reply_00 = (SftpReplyBuilder *)(ulong)(uint)attrs.permissions;
  }
  iVar1 = mkdir(__path,(__mode_t)reply_00);
  free(__path);
  if (-1 < iVar1) {
    (*reply->vt->reply_ok)(reply);
    return;
  }
  uss_error((UnixSftpServer *)reply,reply_00);
  return;
}

Assistant:

static void uss_mkdir(SftpServer *srv, SftpReplyBuilder *reply,
                      ptrlen path, struct fxp_attrs attrs)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *pathstr = mkstr(path);
    int status = mkdir(pathstr, GET_PERMISSIONS(attrs, 0777));
    free(pathstr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}